

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rectangle.cpp
# Opt level: O1

void __thiscall pm::Rectangle::Rectangle(Rectangle *this,Vector3 *point,Vector3 *a,Vector3 *b)

{
  Vector3 local_14;
  
  local_14.x = a->y * b->z - b->y * a->z;
  local_14.y = a->z * b->x - b->z * a->x;
  local_14.z = a->x * b->y - b->x * a->y;
  Rectangle(this,point,a,b,&local_14);
  updateDimensions(this);
  return;
}

Assistant:

Rectangle::Rectangle(const Vector3 &point, const Vector3 &a, const Vector3 &b)
    : Rectangle(point, a, b, cross(a, b))
{
	updateDimensions();
}